

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pd~.c
# Opt level: O2

void pd_tilde_dsp(t_pd_tilde *x,t_signal **sp)

{
  int iVar1;
  t_sample **pptVar2;
  t_signal *ptVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  
  iVar1 = x->x_ninsig;
  if ((iVar1 == 0) && (x->x_noutsig == 0)) {
    iVar4 = 1;
  }
  else {
    iVar4 = (*sp)->s_n;
  }
  x->x_blksize = iVar4;
  pptVar2 = x->x_insig;
  lVar6 = 0;
  iVar4 = 0;
  if (0 < iVar1) {
    iVar4 = iVar1;
  }
  for (; iVar4 != (int)lVar6; lVar6 = lVar6 + 1) {
    ptVar3 = *sp;
    sp = sp + 1;
    pptVar2[lVar6] = ptVar3->s_vec;
  }
  pptVar2 = x->x_outsig;
  uVar7 = 0;
  uVar5 = (ulong)(uint)x->x_noutsig;
  if (x->x_noutsig < 1) {
    uVar5 = uVar7;
  }
  for (; (int)uVar5 != (int)uVar7; uVar7 = uVar7 + 1) {
    pptVar2[uVar7] = sp[(iVar1 == 0) + uVar7]->s_vec;
  }
  dsp_add(pd_tilde_perform,1);
  return;
}

Assistant:

static void pd_tilde_dsp(t_pd_tilde *x, t_signal **sp)
{
    int i;
    t_pdsample **g;

    x->x_blksize = (x->x_ninsig || x->x_noutsig ? sp[0]->s_n : 1);
    for (i = 0, g = x->x_insig; i < x->x_ninsig; i++, g++)
        *g = (*(sp++))->s_vec;
        /* if there were no input signals Pd still provided us with one,
        which we ignore: */
    if (!x->x_ninsig)
        sp++;
    for (i = 0, g = x->x_outsig; i < x->x_noutsig; i++, g++)
        *g = (*(sp++))->s_vec;
    dsp_add(pd_tilde_perform, 1, x);
}